

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

void resizetab(lua_State *L,GCtab *t,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  TValue *pTVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  TValue *oarray;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  TValue *pTVar13;
  
  uVar6 = (ulong)(t->node).ptr32;
  uVar7 = t->asize;
  uVar10 = (ulong)uVar7;
  uVar1 = t->hmask;
  uVar8 = (ulong)asize;
  if (uVar7 < asize) {
    if (0x8000001 < asize) goto LAB_0010a6c2;
    pvVar3 = (void *)(ulong)(t->array).ptr32;
    if (t->colo < '\x01') {
      pvVar2 = lj_mem_realloc(L,pvVar3,uVar7 * 8,asize * 8);
    }
    else {
      pvVar2 = lj_mem_realloc(L,(void *)0x0,0,asize * 8);
      t->colo = t->colo | 0x80;
      for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        *(undefined8 *)((long)pvVar2 + uVar12 * 8) = *(undefined8 *)((long)pvVar3 + uVar12 * 8);
      }
    }
    (t->array).ptr32 = (uint32_t)pvVar2;
    t->asize = asize;
    for (uVar12 = uVar10; uVar12 < uVar8; uVar12 = uVar12 + 1) {
      *(undefined4 *)((long)pvVar2 + uVar12 * 8 + 4) = 0xffffffff;
    }
  }
  if (hbits == 0) {
    (t->node).ptr32 = (L->glref).ptr32 + 0x68;
    t->hmask = 0;
  }
  else {
    if (0x1a < hbits) {
LAB_0010a6c2:
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    uVar11 = 1 << ((byte)hbits & 0x1f);
    pvVar3 = lj_mem_realloc(L,(void *)0x0,0,(MSize)(0x18L << ((byte)hbits & 0x3f)));
    lVar5 = (ulong)uVar11 * 0x18;
    *(uint32_t *)((long)pvVar3 + 0x14) = (uint32_t)pvVar3 + (int)lVar5;
    (t->node).ptr32 = (uint32_t)pvVar3;
    t->hmask = uVar11 - 1;
    for (lVar9 = 0; lVar5 - lVar9 != 0; lVar9 = lVar9 + 0x18) {
      *(undefined8 *)(((ulong)pvVar3 & 0xffffffff) + 0xc + lVar9) = 0xffffffff;
      *(undefined4 *)(((ulong)pvVar3 & 0xffffffff) + 4 + lVar9) = 0xffffffff;
    }
  }
  if (asize < uVar7) {
    pvVar3 = (void *)(ulong)(t->array).ptr32;
    t->asize = asize;
    for (; uVar8 < uVar10; uVar8 = uVar8 + 1) {
      if (*(int *)((long)pvVar3 + uVar8 * 8 + 4) != -1) {
        pTVar4 = lj_tab_setinth(L,t,(int32_t)uVar8);
        *pTVar4 = *(TValue *)((long)pvVar3 + uVar8 * 8);
      }
    }
    if (t->colo < '\x01') {
      pvVar3 = lj_mem_realloc(L,pvVar3,uVar7 << 3,asize << 3);
      (t->array).ptr32 = (uint32_t)pvVar3;
    }
  }
  if ((ulong)uVar1 == 0) {
    return;
  }
  for (uVar7 = 0; uVar7 <= uVar1; uVar7 = uVar7 + 1) {
    if (*(int *)(uVar6 + 4 + (ulong)uVar7 * 0x18) != -1) {
      pTVar13 = (TValue *)((ulong)uVar7 * 0x18 + uVar6);
      pTVar4 = lj_tab_set(L,t,pTVar13 + 1);
      *pTVar4 = *pTVar13;
    }
  }
  uVar8 = (ulong)(L->glref).ptr32;
  lVar5 = (ulong)uVar1 * 0x18 + 0x18;
  *(int *)(uVar8 + 0x20) = *(int *)(uVar8 + 0x20) - (int)lVar5;
  (**(code **)(uVar8 + 0x10))(*(undefined8 *)(uVar8 + 0x18),uVar6,lVar5,0,*(code **)(uVar8 + 0x10));
  return;
}

Assistant:

static void resizetab(lua_State *L, GCtab *t, uint32_t asize, uint32_t hbits)
{
  Node *oldnode = noderef(t->node);
  uint32_t oldasize = t->asize;
  uint32_t oldhmask = t->hmask;
  if (asize > oldasize) {  /* Array part grows? */
    TValue *array;
    uint32_t i;
    if (asize > LJ_MAX_ASIZE)
      lj_err_msg(L, LJ_ERR_TABOV);
    if (LJ_MAX_COLOSIZE != 0 && t->colo > 0) {
      /* A colocated array must be separated and copied. */
      TValue *oarray = tvref(t->array);
      array = lj_mem_newvec(L, asize, TValue);
      t->colo = (int8_t)(t->colo | 0x80);  /* Mark as separated (colo < 0). */
      for (i = 0; i < oldasize; i++)
	copyTV(L, &array[i], &oarray[i]);
    } else {
      array = (TValue *)lj_mem_realloc(L, tvref(t->array),
			  oldasize*sizeof(TValue), asize*sizeof(TValue));
    }
    setmref(t->array, array);
    t->asize = asize;
    for (i = oldasize; i < asize; i++)  /* Clear newly allocated slots. */
      setnilV(&array[i]);
  }
  /* Create new (empty) hash part. */
  if (hbits) {
    newhpart(L, t, hbits);
    clearhpart(t);
  } else {
    global_State *g = G(L);
    setmref(t->node, &g->nilnode);
    t->hmask = 0;
  }
  if (asize < oldasize) {  /* Array part shrinks? */
    TValue *array = tvref(t->array);
    uint32_t i;
    t->asize = asize;  /* Note: This 'shrinks' even colocated arrays. */
    for (i = asize; i < oldasize; i++)  /* Reinsert old array values. */
      if (!tvisnil(&array[i]))
	copyTV(L, lj_tab_setinth(L, t, (int32_t)i), &array[i]);
    /* Physically shrink only separated arrays. */
    if (LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
      setmref(t->array, lj_mem_realloc(L, array,
	      oldasize*sizeof(TValue), asize*sizeof(TValue)));
  }
  if (oldhmask > 0) {  /* Reinsert pairs from old hash part. */
    global_State *g;
    uint32_t i;
    for (i = 0; i <= oldhmask; i++) {
      Node *n = &oldnode[i];
      if (!tvisnil(&n->val))
	copyTV(L, lj_tab_set(L, t, &n->key), &n->val);
    }
    g = G(L);
    lj_mem_freevec(g, oldnode, oldhmask+1, Node);
  }
}